

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

string * __thiscall InstructionAtom::get_sym_abi_cxx11_(InstructionAtom *this)

{
  int *in_RSI;
  string *in_RDI;
  
  if (*in_RSI == 2) {
    std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 4));
    return in_RDI;
  }
  __assert_fail("kind == IMM_SYM",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                ,0x6b,"std::string InstructionAtom::get_sym() const");
}

Assistant:

std::string InstructionAtom::get_sym() const {
  assert(kind == IMM_SYM);
  return sym;
}